

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthForall(uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  int iVar8;
  ulong uVar9;
  
  uVar2 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar2 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x332,"void Kit_TruthForall(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        uVar6 = pTruth[uVar4];
        pTruth[uVar4] = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0xd5555555) * 2 & uVar6;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    break;
  case 1:
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        uVar6 = pTruth[uVar4];
        pTruth[uVar4] = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0xf3333333) * 4 & uVar6;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    break;
  case 2:
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        uVar6 = pTruth[uVar4];
        pTruth[uVar4] = ((uVar6 & 0xf0f0f0f) << 4 | uVar6 >> 4 & 0xf0f0f0f) & uVar6;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    break;
  case 3:
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        uVar6 = pTruth[uVar4];
        pTruth[uVar4] =
             (((uVar6 & 0xff00) << 8 | uVar6 << 0x18) >> 0x10 |
             (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8) << 0x10) & uVar6;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    break;
  case 4:
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        uVar6 = pTruth[uVar4];
        pTruth[uVar4] = (uVar6 << 0x10 | uVar6 >> 0x10) & uVar6;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    break;
  default:
    if (0 < (int)uVar2) {
      bVar3 = (byte)(iVar + -5);
      uVar6 = 1 << (bVar3 & 0x1f);
      iVar5 = 2 << (bVar3 & 0x1f);
      uVar4 = 1;
      if (1 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
      }
      puVar7 = pTruth + (int)uVar6;
      iVar8 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar9 = 0;
          do {
            uVar6 = pTruth[uVar9];
            uVar1 = puVar7[uVar9];
            pTruth[uVar9] = uVar6 & uVar1;
            puVar7[uVar9] = uVar6 & uVar1;
            uVar9 = uVar9 + 1;
          } while (uVar4 != uVar9);
        }
        iVar8 = iVar8 + iVar5;
        puVar7 = puVar7 + iVar5;
        pTruth = pTruth + iVar5;
      } while (iVar8 < (int)uVar2);
    }
  }
  return;
}

Assistant:

void Kit_TruthForall( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] &=  ((pTruth[i] & 0xAAAAAAAA) >> 1) | ((pTruth[i] & 0x55555555) << 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] &=  ((pTruth[i] & 0xCCCCCCCC) >> 2) | ((pTruth[i] & 0x33333333) << 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] &=  ((pTruth[i] & 0xF0F0F0F0) >> 4) | ((pTruth[i] & 0x0F0F0F0F) << 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] &=  ((pTruth[i] & 0xFF00FF00) >> 8) | ((pTruth[i] & 0x00FF00FF) << 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] &=  ((pTruth[i] & 0xFFFF0000) >> 16) | ((pTruth[i] & 0x0000FFFF) << 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pTruth[i]     &= pTruth[Step+i];
                pTruth[Step+i] = pTruth[i];
            }
            pTruth += 2*Step;
        }
        return;
    }
}